

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

bool __thiscall QString::startsWith(QString *this,QLatin1StringView s,CaseSensitivity cs)

{
  QStringView haystack;
  bool bVar1;
  
  haystack.m_data = (this->d).ptr;
  haystack.m_size = (this->d).size;
  bVar1 = (anonymous_namespace)::qt_starts_with_impl<QStringView,QLatin1StringView>(haystack,s,cs);
  return bVar1;
}

Assistant:

bool QString::startsWith(QLatin1StringView s, Qt::CaseSensitivity cs) const
{
    return qt_starts_with_impl(QStringView(*this), s, cs);
}